

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

bool __thiscall
ViconCGStreamIO::VBuffer::Read<float>
          (VBuffer *this,vector<float,_std::allocator<float>_> *o_rValues)

{
  uint *puVar1;
  uint uVar2;
  pointer pfVar3;
  pointer puVar4;
  ulong uVar5;
  pointer __dest;
  ulong __new_size;
  
  pfVar3 = (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
      ._M_finish != pfVar3) {
    (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pfVar3;
  }
  uVar2 = (this->m_BufferImpl).m_Offset;
  puVar4 = (this->m_BufferImpl).m_Buffer.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar2 + 4 <=
      (ulong)((long)(this->m_BufferImpl).m_Buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar4)) {
    __new_size = (ulong)*(uint *)(puVar4 + uVar2);
    (this->m_BufferImpl).m_Offset = uVar2 + 4;
    std::vector<float,_std::allocator<float>_>::resize(o_rValues,__new_size);
    uVar5 = (ulong)(this->m_BufferImpl).m_Offset;
    puVar4 = (this->m_BufferImpl).m_Buffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar5 + __new_size * 4 <=
        (ulong)((long)(this->m_BufferImpl).m_Buffer.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar4)) {
      pfVar3 = (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __dest = (pointer)0x0;
      if (pfVar3 != (o_rValues->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        __dest = pfVar3;
      }
      memcpy(__dest,puVar4 + uVar5,__new_size << 2);
      puVar1 = &(this->m_BufferImpl).m_Offset;
      *puVar1 = *puVar1 + (int)(__new_size << 2);
      return true;
    }
  }
  return false;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }